

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

bool death_prog_outer_guardian(CHAR_DATA *mob,CHAR_DATA *killer)

{
  bool bVar1;
  CHAR_DATA *pCVar2;
  CHAR_DATA *pCVar3;
  CHAR_DATA *in_RSI;
  long in_RDI;
  bool present;
  OBJ_DATA *obj_next;
  OBJ_DATA *obj;
  char buf [4608];
  CHAR_DATA *vch;
  CHAR_DATA *othercabalguardian;
  CHAR_DATA *cabalguardian;
  undefined4 in_stack_ffffffffffffedb8;
  int in_stack_ffffffffffffedbc;
  undefined7 in_stack_ffffffffffffedc0;
  byte bVar4;
  CHAR_DATA *ch;
  CHAR_DATA *obj_00;
  char local_1228 [8];
  OBJ_DATA *in_stack_ffffffffffffede0;
  CHAR_DATA *local_28;
  
  do_cb((CHAR_DATA *)buf._144_8_,(char *)buf._136_8_);
  pCVar2 = get_cabal_guardian(in_stack_ffffffffffffedbc);
  if (pCVar2 != (CHAR_DATA *)0x0) {
    ch = (CHAR_DATA *)pCVar2->carrying;
    while (obj_00 = ch, obj_00 != (CHAR_DATA *)0x0) {
      bVar4 = 0;
      ch = obj_00->next_in_room;
      bVar1 = isCabalItem((OBJ_DATA *)obj_00);
      if ((bVar1) && (*(short *)(obj_00->last_fight_name + 0x54) != pCVar2->cabal)) {
        for (local_28 = in_RSI->in_room->people; local_28 != (CHAR_DATA *)0x0;
            local_28 = local_28->next_in_room) {
          bVar1 = is_same_group(local_28,in_RSI);
          if ((bVar1) && (*(short *)(obj_00->last_fight_name + 0x54) == local_28->cabal)) {
            bVar4 = 1;
          }
        }
        if (((bVar4 & 1) != 0) &&
           (pCVar3 = get_cabal_guardian(in_stack_ffffffffffffedbc), pCVar3 != (CHAR_DATA *)0x0)) {
          sprintf(local_1228,"As %s falls, %s returns to %s!",*(undefined8 *)(in_RDI + 0x108),
                  obj_00->affected,pCVar3->short_descr);
          obj_from_char(in_stack_ffffffffffffede0);
          obj_to_char((OBJ_DATA *)CONCAT17(bVar4,in_stack_ffffffffffffedc0),
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8));
          act((char *)obj_00,ch,(void *)CONCAT17(bVar4,in_stack_ffffffffffffedc0),
              (void *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8),0);
          cabal_shudder((int)((ulong)obj_00 >> 0x20),SUB81((ulong)obj_00 >> 0x18,0));
        }
      }
    }
    save_cabal_items();
  }
  return false;
}

Assistant:

bool death_prog_outer_guardian(CHAR_DATA *mob, CHAR_DATA *killer)
{
	CHAR_DATA *cabalguardian, *othercabalguardian, *vch;
	char buf[MSL];
	OBJ_DATA *obj, *obj_next;
	bool present;

	do_cb(mob, "Alas, my life has come to an end.");

	if ((cabalguardian = get_cabal_guardian(mob->cabal)) != nullptr)
	{
		for (obj = cabalguardian->carrying; obj != nullptr; obj = obj_next)
		{
			present= false;
			obj_next = obj->next_content;

			if (!isCabalItem(obj))
				continue;

			if (obj->pIndexData->cabal != cabalguardian->cabal)
			{
				for (vch = killer->in_room->people; vch != nullptr; vch = vch->next_in_room)
				{
					if (is_same_group(vch, killer))
					{
						if (obj->pIndexData->cabal == vch->cabal)
						{
							present = true;
						}
					}
				}
				if (present && (othercabalguardian = get_cabal_guardian(obj->pIndexData->cabal)) != nullptr)
				{
					sprintf(buf, "As %s falls, %s returns to %s!",
						mob->short_descr,
						obj->short_descr,
						othercabalguardian->short_descr);

					obj_from_char(obj);
					obj_to_char(obj, othercabalguardian);

					act(buf, mob, 0, 0, TO_ALL);
					cabal_shudder(obj->pIndexData->cabal, false);
				}
			}
		}

		save_cabal_items();
	}

	return false;
}